

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluReverseOrder_old(word *pF,int nVars,int *V2P,int *P2V,int iVarStart)

{
  uint uVar1;
  int p;
  ulong uVar2;
  bool bVar3;
  word pG [1024];
  word local_2038 [1025];
  
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (0 < (int)uVar1) {
    memcpy(local_2038,pF,(ulong)uVar1 * 8);
  }
  if (iVarStart < nVars) {
    p = nVars + -1;
    do {
      If_CluMoveVar(pF,nVars,V2P,P2V,P2V[iVarStart],p);
      bVar3 = p != iVarStart;
      p = p + -1;
    } while (bVar3);
  }
  If_CluReverseOrder(local_2038,nVars,(int *)0x0,(int *)0x0,iVarStart);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      if (local_2038[uVar2] != pF[uVar2]) {
        printf("%d ",(ulong)(uint)nVars);
        return;
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

void If_CluReverseOrder_old( word * pF, int nVars, int * V2P, int * P2V, int iVarStart )
{
    word pG[CLU_WRD_MAX];
    int v;

    If_CluCopy( pG, pF, nVars );

//    for ( v = 0; v < nVars; v++ )
//        printf( "%c ", 'a' + P2V[v] );
//    printf( "  ---  " );

    for ( v = iVarStart; v < nVars; v++ )
        If_CluMoveVar( pF, nVars, V2P, P2V, P2V[iVarStart], nVars - 1 - (v - iVarStart) );

//    for ( v = 0; v < nVars; v++ )
//        printf( "%c ", 'a' + P2V[v] );
//    printf( "\n" );

//    if ( iVarStart > 0 )
//        return;

    If_CluReverseOrder( pG, nVars, NULL, NULL, iVarStart );
    if ( If_CluEqual( pG, pF, nVars ) )
    {
//        printf( "+" );
    }
    else
    {
/*
        printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pG, nVars ); 
        printf( "\n" );
*/
        printf( "%d ", nVars );
    }
}